

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code-generator.cpp
# Opt level: O1

void generateAsm<false>(uint32_t nonce)

{
  long lVar1;
  uint8_t *puVar2;
  undefined8 *puVar3;
  AssemblyGeneratorX86 asmX86;
  uint64_t hash [8];
  uint8_t blockTemplate [76];
  Program p;
  uint8_t scratchpad [262144];
  undefined1 auStack_404c0 [128];
  ios_base aiStack_40440 [296];
  undefined1 auStack_40318 [64];
  undefined8 auStack_402d8 [4];
  uint32_t uStack_402b1;
  undefined4 uStack_40290;
  Program PStack_40288;
  undefined1 auStack_40008 [262144];
  
  puVar2 = blockTemplate_;
  puVar3 = auStack_402d8;
  for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
    *puVar3 = *(undefined8 *)puVar2;
    puVar2 = puVar2 + 8;
    puVar3 = puVar3 + 1;
  }
  uStack_40290 = 0x961d561;
  uStack_402b1 = nonce;
  blake2b(auStack_40318,0x40,auStack_402d8,0x4c,(void *)0x0,0);
  fillAes1Rx4<false>(auStack_40318,0x40000,auStack_40008);
  std::__cxx11::stringstream::stringstream((stringstream *)auStack_404c0);
  fillAes4Rx4<false>(auStack_40318,0x280,&PStack_40288);
  defyx::AssemblyGeneratorX86::generateProgram((AssemblyGeneratorX86 *)auStack_404c0,&PStack_40288);
  std::ostream::operator<<(&std::cout,(streambuf *)(auStack_404c0 + 0x18));
  std::__cxx11::stringstream::~stringstream((stringstream *)auStack_404c0);
  std::ios_base::~ios_base(aiStack_40440);
  return;
}

Assistant:

void generateAsm(uint32_t nonce) {
	alignas(16) uint64_t hash[8];
	uint8_t blockTemplate[sizeof(blockTemplate_)];
	memcpy(blockTemplate, blockTemplate_, sizeof(blockTemplate));
	store32(blockTemplate + 39, nonce);
	blake2b(hash, sizeof(hash), blockTemplate, sizeof(blockTemplate), nullptr, 0);
	uint8_t scratchpad[defyx::ScratchpadSize];
	fillAes1Rx4<softAes>((void*)hash, defyx::ScratchpadSize, scratchpad);
	defyx::AssemblyGeneratorX86 asmX86;
	defyx::Program p;
	fillAes4Rx4<softAes>(hash, sizeof(p), &p);
	asmX86.generateProgram(p);
	asmX86.printCode(std::cout);
}